

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O1

void __thiscall
t_js_generator::generate_serialize_struct
          (t_js_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  ostream *poVar1;
  
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".write(output);",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_js_generator::generate_serialize_struct(ostream& out, t_struct* tstruct, string prefix) {
  (void)tstruct;
  indent(out) << prefix << ".write(output);" << endl;
}